

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
~TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                *this,void **vtt)

{
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZVec<int>::~TPZVec(&this->fNumElConnectedBackup);
  TPZVec<int>::~TPZVec(&this->fNumElConnected);
  TPZFrontNonSym<long_double>::~TPZFrontNonSym(&this->fFront);
  TPZStackEqnStorage<long_double>::~TPZStackEqnStorage(&this->fStorage);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}